

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O2

void bindSuperClass(VM *vm,Class *subClass,Class *superClass)

{
  Method *pMVar1;
  ulong uVar2;
  long lVar3;
  Method method;
  
  subClass->superClass = superClass;
  subClass->fieldNum = subClass->fieldNum + superClass->fieldNum;
  lVar3 = 8;
  for (uVar2 = 0; uVar2 < (superClass->methods).count; uVar2 = uVar2 + 1) {
    pMVar1 = (superClass->methods).datas;
    method._4_4_ = 0;
    method.type = *(uint *)((long)pMVar1 + lVar3 + -8);
    method.field_1.primFn =
         ((anon_union_8_2_f04a2db6_for_Method_1 *)((long)&pMVar1->type + lVar3))->primFn;
    bindMethod(vm,subClass,(uint32_t)uVar2,method);
    lVar3 = lVar3 + 0x10;
  }
  return;
}

Assistant:

void bindSuperClass(VM *vm, Class *subClass, Class *superClass) {
    subClass->superClass = superClass;
    subClass->fieldNum += superClass->fieldNum;
    uint32_t idx = 0;
    while (idx < superClass->methods.count) {
        bindMethod(vm, subClass, idx, superClass->methods.datas[idx]);
        idx++;
    }
}